

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nalUnits.cpp
# Opt level: O3

int __thiscall SPSUnit::hrd_parameters(SPSUnit *this,HRDParams *params)

{
  bool bVar1;
  uint uVar2;
  undefined8 *puVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  BitStreamReader *this_00;
  
  this_00 = &(this->super_NALUnit).bitReader;
  uVar5 = 0xffffffff;
  do {
    bVar1 = BitStreamReader::getBit(this_00);
    uVar5 = uVar5 + 1;
  } while (!bVar1);
  if (0x20 < uVar5) {
LAB_001c2a59:
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = &PTR__exception_0023ca88;
    __cxa_throw(puVar3,&BitStreamException::typeinfo,std::exception::~exception);
  }
  uVar2 = BitStreamReader::getBits(this_00,uVar5);
  uVar2 = uVar2 + ~(-1 << ((byte)uVar5 & 0x1f));
  params->cpb_cnt_minus1 = uVar2;
  iVar4 = 1;
  if (uVar2 < 0x20) {
    uVar5 = BitStreamReader::getBits(this_00,4);
    params->bit_rate_scale = (uint8_t)uVar5;
    uVar5 = BitStreamReader::getBits(this_00,4);
    params->cpb_size_scale = (uint8_t)uVar5;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&params->bit_rate_value_minus1,(ulong)(params->cpb_cnt_minus1 + 1));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&params->cpb_size_value_minus1,(ulong)(params->cpb_cnt_minus1 + 1));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&params->cbr_flag,(ulong)(params->cpb_cnt_minus1 + 1));
    uVar6 = 0;
    do {
      uVar5 = 0xffffffff;
      do {
        bVar1 = BitStreamReader::getBit(this_00);
        uVar5 = uVar5 + 1;
      } while (!bVar1);
      if (0x20 < uVar5) goto LAB_001c2a59;
      uVar2 = BitStreamReader::getBits(this_00,uVar5);
      uVar2 = uVar2 + ~(-1 << ((byte)uVar5 & 0x1f));
      (params->bit_rate_value_minus1).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar6] = uVar2;
      if (uVar2 == 0xffffffff) {
        return 1;
      }
      uVar5 = 0xffffffff;
      do {
        bVar1 = BitStreamReader::getBit(this_00);
        uVar5 = uVar5 + 1;
      } while (!bVar1);
      if (0x20 < uVar5) goto LAB_001c2a59;
      uVar2 = BitStreamReader::getBits(this_00,uVar5);
      uVar2 = uVar2 + ~(-1 << ((byte)uVar5 & 0x1f));
      (params->cpb_size_value_minus1).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar6] = uVar2;
      if (uVar2 == 0xffffffff) {
        return 1;
      }
      bVar1 = BitStreamReader::getBit(this_00);
      (params->cbr_flag).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[uVar6] = bVar1;
      bVar1 = uVar6 < params->cpb_cnt_minus1;
      uVar6 = uVar6 + 1;
    } while (bVar1);
    uVar5 = BitStreamReader::getBits(this_00,5);
    params->initial_cpb_removal_delay_length_minus1 = (uint8_t)uVar5;
    uVar5 = BitStreamReader::getBits(this_00,5);
    params->cpb_removal_delay_length_minus1 = (uint8_t)uVar5;
    uVar5 = BitStreamReader::getBits(this_00,5);
    params->dpb_output_delay_length_minus1 = (uint8_t)uVar5;
    uVar5 = BitStreamReader::getBits(this_00,5);
    params->time_offset_length = (uint8_t)uVar5;
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int SPSUnit::hrd_parameters(HRDParams& params)
{
    params.cpb_cnt_minus1 = extractUEGolombCode();
    if (params.cpb_cnt_minus1 >= 32)
        return 1;
    params.bit_rate_scale = bitReader.getBits<uint8_t>(4);
    params.cpb_size_scale = bitReader.getBits<uint8_t>(4);

    params.bit_rate_value_minus1.resize(params.cpb_cnt_minus1 + 1);
    params.cpb_size_value_minus1.resize(params.cpb_cnt_minus1 + 1);
    params.cbr_flag.resize(params.cpb_cnt_minus1 + 1);

    for (size_t SchedSelIdx = 0; SchedSelIdx <= params.cpb_cnt_minus1; SchedSelIdx++)
    {
        params.bit_rate_value_minus1[SchedSelIdx] = extractUEGolombCode();
        if (params.bit_rate_value_minus1[SchedSelIdx] == UINT_MAX)
            return 1;
        params.cpb_size_value_minus1[SchedSelIdx] = extractUEGolombCode();
        if (params.cpb_size_value_minus1[SchedSelIdx] == UINT_MAX)
            return 1;
        params.cbr_flag[SchedSelIdx] = bitReader.getBit();
    }
    params.initial_cpb_removal_delay_length_minus1 = bitReader.getBits<uint8_t>(5);
    params.cpb_removal_delay_length_minus1 = bitReader.getBits<uint8_t>(5);
    params.dpb_output_delay_length_minus1 = bitReader.getBits<uint8_t>(5);
    params.time_offset_length = bitReader.getBits<uint8_t>(5);

    return 0;
}